

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O3

void __thiscall
wigwag::detail::
listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::finalize_nodes(listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                 *this)

{
  int *piVar1;
  intrusive_list_node *piVar2;
  intrusive_list_node *piVar3;
  intrusive_list_node *piVar4;
  intrusive_list_node *piVar5;
  iterator tmp;
  
  piVar2 = (this->_handlers)._root._next;
  while (piVar5 = piVar2, piVar5 != &(this->_handlers)._root) {
    piVar2 = piVar5->_next;
    LOCK();
    piVar1 = (int *)((long)&piVar5[-1]._next + 4);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      piVar3 = piVar5->_prev;
      piVar4 = piVar5->_next;
      piVar4->_prev = piVar3;
      piVar3->_next = piVar4;
      piVar5->_next = piVar5;
      piVar5->_prev = piVar5;
      (*(code *)piVar5[-2]._next[1]._prev)(&piVar5[-2]._next);
    }
  }
  return;
}

Assistant:

void finalize_nodes()
        {
            for (auto it = _handlers.begin(); it != _handlers.end();)
                (it++)->finalize_node();
        }